

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O2

dill_reg cg_get_static_block(dill_stream s,cod_code descr)

{
  dill_reg dVar1;
  
  if (descr->static_block_address_register != -1) {
    return descr->static_block_address_register;
  }
  dVar1 = dill_getreg(s,8);
  descr->static_block_address_register = dVar1;
  return dVar1;
}

Assistant:

static dill_reg 
cg_get_static_block(dill_stream s, cod_code descr)
{
    dill_reg ret;
    if (descr->static_block_address_register != -1) {
	return descr->static_block_address_register;
    } else {
	ret = dill_getreg(s, DILL_P);
	descr->static_block_address_register = ret;
	return ret;
    }
}